

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall
fasttext::FastText::supervised
          (FastText *this,Model *model,real lr,vector<int,_std::allocator<int>_> *line,
          vector<int,_std::allocator<int>_> *labels)

{
  result_type_conflict1 rVar1;
  ulong uVar2;
  uniform_int_distribution<int> uniform;
  uniform_int_distribution<int> local_20;
  
  uVar2 = (long)(labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if ((uVar2 != 0) &&
     ((line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
     )) {
    local_20._M_param._M_b = (int)(uVar2 >> 2) + -1;
    local_20._M_param._M_a = 0;
    rVar1 = std::uniform_int_distribution<int>::operator()(&local_20,&model->rng);
    Model::update(model,line,
                  (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[rVar1],lr);
  }
  return;
}

Assistant:

void FastText::supervised(Model& model, real lr,
                          const std::vector<int32_t>& line,
                          const std::vector<int32_t>& labels) {
  if (labels.size() == 0 || line.size() == 0) return;
  std::uniform_int_distribution<> uniform(0, labels.size() - 1);
  int32_t i = uniform(model.rng);
  model.update(line, labels[i], lr);
}